

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int uv_pipe_bind(uv_pipe_t *handle,char *name)

{
  byte *pbVar1;
  int __fd;
  int iVar2;
  char *__src;
  int *piVar3;
  sockaddr_un saddr;
  sockaddr local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined6 uStack_40;
  undefined2 local_3a;
  undefined6 uStack_38;
  ulong uStack_32;
  
  iVar2 = -0x16;
  if ((handle->io_watcher).fd < 0) {
    __src = uv__strdup(name);
    if (__src == (char *)0x0) {
      iVar2 = -0xc;
    }
    else {
      __fd = uv__socket(1,1,0);
      iVar2 = __fd;
      if (-1 < __fd) {
        uStack_38 = 0;
        uStack_32 = 0;
        uStack_48 = 0;
        uStack_40 = 0;
        local_3a = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98.sa_family = 0;
        local_98.sa_data[0] = '\0';
        local_98.sa_data[1] = '\0';
        local_98.sa_data[2] = '\0';
        local_98.sa_data[3] = '\0';
        local_98.sa_data[4] = '\0';
        local_98.sa_data[5] = '\0';
        local_98.sa_data[6] = '\0';
        local_98.sa_data[7] = '\0';
        local_98.sa_data[8] = '\0';
        local_98.sa_data[9] = '\0';
        local_98.sa_data[10] = '\0';
        local_98.sa_data[0xb] = '\0';
        local_98.sa_data[0xc] = '\0';
        local_98.sa_data[0xd] = '\0';
        strncpy(local_98.sa_data,__src,0x6b);
        uStack_32 = uStack_32 & 0xffffffffffffff;
        local_98.sa_family = 1;
        iVar2 = bind(__fd,&local_98,0x6e);
        if (iVar2 == 0) {
          pbVar1 = (byte *)((long)&handle->flags + 2);
          *pbVar1 = *pbVar1 | 4;
          handle->pipe_fname = __src;
          (handle->io_watcher).fd = __fd;
          return 0;
        }
        piVar3 = __errno_location();
        iVar2 = -0xd;
        if (*piVar3 != 2) {
          iVar2 = -*piVar3;
        }
        uv__close(__fd);
      }
      uv__free(__src);
    }
  }
  return iVar2;
}

Assistant:

int uv_pipe_bind(uv_pipe_t* handle, const char* name) {
  struct sockaddr_un saddr;
  const char* pipe_fname = NULL;
  int sockfd = -1;
  int err;

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return -EINVAL;

  /* Make a copy of the file name, it outlives this function's scope. */
  pipe_fname = uv__strdup(name);
  if (pipe_fname == NULL)
    return -ENOMEM;

  /* We've got a copy, don't touch the original any more. */
  name = NULL;

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto err_socket;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  strncpy(saddr.sun_path, pipe_fname, sizeof(saddr.sun_path) - 1);
  saddr.sun_path[sizeof(saddr.sun_path) - 1] = '\0';
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, sizeof saddr)) {
    err = -errno;
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == -ENOENT)
      err = -EACCES;

    uv__close(sockfd);
    goto err_socket;
  }

  /* Success. */
  handle->flags |= UV_HANDLE_BOUND;
  handle->pipe_fname = pipe_fname; /* Is a strdup'ed copy. */
  handle->io_watcher.fd = sockfd;
  return 0;

err_socket:
  uv__free((void*)pipe_fname);
  return err;
}